

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3229:36)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3229:36)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 *puVar3;
  pointer *ppcVar4;
  pointer *ppcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  size_type __dnew;
  pointer *local_d0;
  pointer local_c8;
  pointer local_c0;
  undefined8 uStack_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  uint *local_40 [2];
  
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_assign((string *)&local_b0);
  local_68 = 0;
  local_70 = &PTR__BasicResult_001b1540;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  parseUInt((Catch *)local_40,&local_b0,10);
  if (local_40[0] == (uint *)0x0) {
    std::operator+(&local_90,"Could not parse \'",&local_b0);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_d0 = &local_c0;
    ppcVar5 = (pointer *)(puVar3 + 2);
    if ((pointer *)*puVar3 == ppcVar5) {
      local_c0 = *ppcVar5;
      uStack_b8 = puVar3[3];
      ppcVar4 = local_d0;
    }
    else {
      local_c0 = *ppcVar5;
      ppcVar4 = (pointer *)*puVar3;
    }
    sVar2 = puVar3[1];
    *puVar3 = ppcVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (ppcVar4 == local_d0) {
      paVar1->_M_allocated_capacity = (size_type)local_c0;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_b8;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)ppcVar4;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = (size_type)local_c0;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
    local_c8 = (pointer)0x0;
    local_c0 = (pointer)((ulong)local_c0 & 0xffffffffffffff00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    if (*local_40[0] == 0) {
      local_90._M_dataplus._M_p = (pointer)0x1c;
      local_d0 = &local_c0;
      local_d0 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_90);
      local_c0 = local_90._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_d0 + 0xc),"must be ",8);
      builtin_strncpy((char *)((long)local_d0 + 0x14),"positive",8);
      *local_d0 = (pointer)0x6f63206472616853;
      local_d0[1] = (pointer)0x7473756d20746e75;
      local_c8 = local_90._M_dataplus._M_p;
      *(char *)((long)local_d0 + (long)local_90._M_dataplus._M_p) = '\0';
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = RuntimeError;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_d0 == &local_c0) {
        paVar1->_M_allocated_capacity = (size_type)local_90._M_dataplus._M_p;
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_b8;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_d0;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             (size_type)local_90._M_dataplus._M_p;
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length =
           (size_type)local_90._M_dataplus._M_p;
    }
    else {
      ((this->m_lambda).config)->shardCount = *local_40[0];
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1540;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    }
  }
  local_70 = &PTR__BasicResult_001b1540;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }